

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::RegexPattern::RegexPattern
          (RegexPattern *this,JavascriptLibrary *library,Program *program,bool isLiteral)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01559630;
  (this->testCache).ptr = (RegExpTestCache *)0x0;
  Memory::Recycler::WBSetBit((char *)&this->library);
  (this->library).ptr = library;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->library);
  this->field_0x18 = this->field_0x18 & 0xfc | isLiteral;
  (this->rep).unified.program.ptr = (Program *)0x0;
  (this->rep).unified.matcher.ptr = (Matcher *)0x0;
  (this->rep).unified.trigramInfo.ptr = (TrigramInfo *)0x0;
  Memory::Recycler::WBSetBit((char *)&this->rep);
  (this->rep).unified.program.ptr = program;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->rep);
  (this->rep).unified.matcher.ptr = (Matcher *)0x0;
  (this->rep).unified.trigramInfo.ptr = (TrigramInfo *)0x0;
  return;
}

Assistant:

RegexPattern::RegexPattern(Js::JavascriptLibrary *const library, Program* program, bool isLiteral)
        : library(library), isLiteral(isLiteral), isShallowClone(false), testCache(nullptr)
    {
        rep.unified.program = program;
        rep.unified.matcher = nullptr;
        rep.unified.trigramInfo = nullptr;
    }